

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall
ON_PointCloud::GetBBox(ON_PointCloud *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  double *pdVar1;
  bool bVar2;
  bool rc;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_PointCloud *this_local;
  
  bVar2 = ON_BoundingBox::IsValid(&this->m_bbox);
  if (!bVar2) {
    ON_3dPointArray::GetBBox(&this->m_P,(double *)&this->m_bbox,&(this->m_bbox).m_max.x,false);
  }
  bVar2 = ON_BoundingBox::IsValid(&this->m_bbox);
  if (bVar2) {
    if (bGrowBox) {
      if (boxmin != (double *)0x0) {
        if ((this->m_bbox).m_min.x <= *boxmin && *boxmin != (this->m_bbox).m_min.x) {
          *boxmin = (this->m_bbox).m_min.x;
        }
        pdVar1 = &(this->m_bbox).m_min.y;
        if (*pdVar1 <= boxmin[1] && boxmin[1] != *pdVar1) {
          boxmin[1] = (this->m_bbox).m_min.y;
        }
        pdVar1 = &(this->m_bbox).m_min.z;
        if (*pdVar1 <= boxmin[2] && boxmin[2] != *pdVar1) {
          boxmin[2] = (this->m_bbox).m_min.z;
        }
      }
      if (boxmax != (double *)0x0) {
        if (*boxmax < (this->m_bbox).m_max.x) {
          *boxmax = (this->m_bbox).m_max.x;
        }
        if (boxmax[1] < (this->m_bbox).m_max.y) {
          boxmax[1] = (this->m_bbox).m_max.y;
        }
        if (boxmax[2] < (this->m_bbox).m_max.z) {
          boxmax[2] = (this->m_bbox).m_max.z;
        }
      }
    }
    else {
      if (boxmin != (double *)0x0) {
        *boxmin = (this->m_bbox).m_min.x;
        boxmin[1] = (this->m_bbox).m_min.y;
        boxmin[2] = (this->m_bbox).m_min.z;
      }
      if (boxmax != (double *)0x0) {
        *boxmax = (this->m_bbox).m_max.x;
        boxmax[1] = (this->m_bbox).m_max.y;
        boxmax[2] = (this->m_bbox).m_max.z;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_PointCloud::GetBBox( // returns true if successful
       double* boxmin,    // minimum
       double* boxmax,    // maximum
       bool bGrowBox  // true means grow box
       ) const
{
  if ( !m_bbox.IsValid() ) {
    m_P.GetBBox( (double*)&m_bbox.m_min.x, (double*)&m_bbox.m_max.x, false );
  }
  bool rc = m_bbox.IsValid();
  if (rc) {
    if ( bGrowBox ) {
      if ( boxmin ) {
        if ( boxmin[0] > m_bbox.m_min.x ) boxmin[0] = m_bbox.m_min.x;
        if ( boxmin[1] > m_bbox.m_min.y ) boxmin[1] = m_bbox.m_min.y;
        if ( boxmin[2] > m_bbox.m_min.z ) boxmin[2] = m_bbox.m_min.z;
      }
      if ( boxmax ) {
        if ( boxmax[0] < m_bbox.m_max.x ) boxmax[0] = m_bbox.m_max.x;
        if ( boxmax[1] < m_bbox.m_max.y ) boxmax[1] = m_bbox.m_max.y;
        if ( boxmax[2] < m_bbox.m_max.z ) boxmax[2] = m_bbox.m_max.z;
      }
    }
    else {
      if ( boxmin ) {
        boxmin[0] = m_bbox.m_min.x;
        boxmin[1] = m_bbox.m_min.y;
        boxmin[2] = m_bbox.m_min.z;
      }
      if ( boxmax ) {
        boxmax[0] = m_bbox.m_max.x;
        boxmax[1] = m_bbox.m_max.y;
        boxmax[2] = m_bbox.m_max.z;
      }
    }
  }
  return rc;
}